

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::RegridOnly(Amr *this,Real time,bool do_io)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (iVar4 == 0) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])(this);
  }
  else {
    iVar4 = iVar4 + -1;
    iVar1 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar1 <= iVar4) {
      iVar4 = iVar1;
    }
    if (-1 < iVar4) {
      uVar3 = 0;
      do {
        (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,uVar3,0);
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
      } while (iVar4 + 1U != uVar2);
    }
  }
  if (do_io) {
    if ((anonymous_namespace)::plotfile_on_restart != 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
    }
    if ((anonymous_namespace)::checkpoint_on_restart != 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
      return;
    }
  }
  return;
}

Assistant:

void
Amr::RegridOnly (Real time, bool do_io)
{
    BL_ASSERT(regrid_on_restart == 1);

    if (max_level == 0)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i = 0; i <= lev_top; i++)
        {
           regrid(i,time);
        }
    }

    if (do_io) {

        if (plotfile_on_restart)
            writePlotFile();

        if (checkpoint_on_restart)
            checkPoint();

        if (insitu_on_restart)
            updateInSitu();

    }
}